

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::CastExpressionSyntax::setChild
          (CastExpressionSyntax *this,size_t index,TokenOrSyntax child)

{
  Info *pIVar1;
  undefined1 uVar2;
  NumericTokenFlags NVar3;
  uint32_t uVar4;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar5;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ParenthesizedExpressionSyntax *pPVar7;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar8;
  
  if (index == 2) {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pPVar7 = (ParenthesizedExpressionSyntax *)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pPVar7 = (ParenthesizedExpressionSyntax *)*ppSVar6;
    }
    (this->right).ptr = pPVar7;
  }
  else if (index == 1) {
    pvVar5 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar2 = pvVar5->field_0x2;
    NVar3.raw = (pvVar5->numFlags).raw;
    uVar4 = pvVar5->rawLen;
    pIVar1 = pvVar5->info;
    (this->apostrophe).kind = pvVar5->kind;
    (this->apostrophe).field_0x2 = uVar2;
    (this->apostrophe).numFlags = (NumericTokenFlags)NVar3.raw;
    (this->apostrophe).rawLen = uVar4;
    (this->apostrophe).info = pIVar1;
  }
  else {
    ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    if (*ppSVar6 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pSVar8 = (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0;
    }
    else {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           &child);
      pSVar8 = *ppSVar6;
    }
    (this->left).ptr = (ExpressionSyntax *)pSVar8;
  }
  return;
}

Assistant:

void CastExpressionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: left = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 1: apostrophe = child.token(); return;
        case 2: right = child.node() ? &child.node()->as<ParenthesizedExpressionSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}